

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::walkModule(Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
             *this,Module *module)

{
  Module *module_local;
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *this_local;
  
  setModule(this,module);
  anon_unknown_22::Unsubtyping::doWalkModule
            ((Unsubtyping *)(this[-1].stack.fixed._M_elems + 7),module);
  Visitor<wasm::(anonymous_namespace)::Unsubtyping,_void>::visitModule
            ((Visitor<wasm::(anonymous_namespace)::Unsubtyping,_void> *)this,module);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkModule(Module* module) {
    setModule(module);
    static_cast<SubType*>(this)->doWalkModule(module);
    static_cast<SubType*>(this)->visitModule(module);
    setModule(nullptr);
  }